

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Parser::Parse(Parser *this,char *source)

{
  bool bVar1;
  uoffset_t uVar2;
  char *name;
  reference ppSVar3;
  reference ppEVar4;
  reference ppEVar5;
  size_type sVar6;
  string *msg;
  EnumVal *local_148;
  EnumVal *val;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_138;
  iterator it_2;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_120;
  iterator it_1;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_f8;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_f0;
  iterator it;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string root_type;
  string local_78;
  allocator local_51;
  string local_50;
  char *local_20;
  char *source_local;
  Parser *this_local;
  
  this->cursor_ = source;
  this->source_ = source;
  this->line_ = 1;
  local_20 = source;
  source_local = (char *)this;
  std::__cxx11::string::clear();
  FlatBufferBuilder::Clear(&this->builder_);
  Next(this);
  while (this->token_ != 0) {
    if (this->token_ == 9) {
      Next(this);
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->name_space_,&this->attribute_);
        Expect(this,4);
        bVar1 = IsNext(this,0x2e);
      } while (bVar1);
      Expect(this,0x3b);
    }
    else if (this->token_ == 0x7b) {
      if (this->root_struct_def == (StructDef *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_50,"no root type set to parse json with",&local_51);
        Error(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
      }
      uVar2 = FlatBufferBuilder::GetSize(&this->builder_);
      if (uVar2 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_78,"cannot have more than one json object in a file",
                   (allocator *)(root_type.field_2._M_local_buf + 0xf));
        Error(&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)(root_type.field_2._M_local_buf + 0xf));
      }
      uVar2 = ParseTable(this,this->root_struct_def);
      Offset<flatbuffers::Table>::Offset
                ((Offset<flatbuffers::Table> *)((long)&root_type.field_2 + 8),uVar2);
      FlatBufferBuilder::Finish<flatbuffers::Table>
                (&this->builder_,(Offset<flatbuffers::Table>)root_type.field_2._8_4_);
    }
    else if (this->token_ == 7) {
      ParseEnum(this,false);
    }
    else if (this->token_ == 8) {
      ParseEnum(this,true);
    }
    else if (this->token_ == 10) {
      Next(this);
      std::__cxx11::string::string((string *)local_a0,(string *)&this->attribute_);
      Expect(this,4);
      Expect(this,0x3b);
      name = (char *)std::__cxx11::string::c_str();
      bVar1 = SetRootType(this,name);
      if (!bVar1) {
        std::operator+(&local_c0,"unknown root type: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        Error(&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      if ((this->root_struct_def->fixed & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_e0,"root type must be a table",
                   (allocator *)((long)&it._M_current + 7));
        Error(&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      ParseDecl(this);
    }
  }
  local_f0._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(this->structs_).vec);
  while( true ) {
    local_f8._M_current =
         (StructDef **)
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                   (&(this->structs_).vec);
    bVar1 = __gnu_cxx::operator!=(&local_f0,&local_f8);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_f0);
    if (((*ppSVar3)->predecl & 1U) != 0) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                ::operator*(&local_f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                     "type referenced but not defined: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppSVar3);
      Error((string *)&it_1);
      std::__cxx11::string::~string((string *)&it_1);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_f0);
  }
  local_120._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(this->enums_).vec);
  while( true ) {
    enum_def = (EnumDef *)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (&(this->enums_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_120,
                       (__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&enum_def);
    if (!bVar1) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_120);
    it_2._M_current = (EnumVal **)*ppEVar4;
    if ((((EnumDef *)it_2._M_current)->is_union & 1U) != 0) {
      local_138._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (&(((EnumDef *)it_2._M_current)->vals).vec);
      while( true ) {
        val = (EnumVal *)
              std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                        ((vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *)
                         (it_2._M_current + 0x18));
        bVar1 = __gnu_cxx::operator!=
                          (&local_138,
                           (__normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&val);
        if (!bVar1) break;
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_138);
        local_148 = *ppEVar5;
        if ((local_148->struct_def != (StructDef *)0x0) &&
           ((local_148->struct_def->fixed & 1U) != 0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                         "only tables can be union elements: ",&local_148->name);
          Error((string *)&msg);
          std::__cxx11::string::~string((string *)&msg);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_138);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_120);
  }
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->struct_stack_);
  if (sVar6 == 0) {
    return true;
  }
  __assert_fail("!struct_stack_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                ,0x2d0,"bool flatbuffers::Parser::Parse(const char *)");
}

Assistant:

bool Parser::Parse(const char *source) {
  source_ = cursor_ = source;
  line_ = 1;
  error_.clear();
  builder_.Clear();
  try {
    Next();
    while (token_ != kTokenEof) {
      if (token_ == kTokenNameSpace) {
        Next();
        for (;;) {
          name_space_.push_back(attribute_);
          Expect(kTokenIdentifier);
          if (!IsNext('.')) break;
        }
        Expect(';');
      } else if (token_ == '{') {
        if (!root_struct_def) Error("no root type set to parse json with");
        if (builder_.GetSize()) {
          Error("cannot have more than one json object in a file");
        }
        builder_.Finish(Offset<Table>(ParseTable(*root_struct_def)));
      } else if (token_ == kTokenEnum) {
        ParseEnum(false);
      } else if (token_ == kTokenUnion) {
        ParseEnum(true);
      } else if (token_ == kTokenRootType) {
        Next();
        auto root_type = attribute_;
        Expect(kTokenIdentifier);
        Expect(';');
        if (!SetRootType(root_type.c_str()))
          Error("unknown root type: " + root_type);
        if (root_struct_def->fixed)
          Error("root type must be a table");
      } else {
        ParseDecl();
      }
    }
    for (auto it = structs_.vec.begin(); it != structs_.vec.end(); ++it) {
      if ((*it)->predecl)
        Error("type referenced but not defined: " + (*it)->name);
    }
    for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
      auto &enum_def = **it;
      if (enum_def.is_union) {
        for (auto it = enum_def.vals.vec.begin();
             it != enum_def.vals.vec.end();
             ++it) {
          auto &val = **it;
          if (val.struct_def && val.struct_def->fixed)
            Error("only tables can be union elements: " + val.name);
        }
      }
    }
  } catch (const std::string &msg) {
    error_ = "line " + NumToString(line_) + ": " + msg;
    return false;
  }
  assert(!struct_stack_.size());
  return true;
}